

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderMoveToNextAttribute(xmlTextReaderPtr reader)

{
  xmlNsPtr ns;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node->type == XML_ELEMENT_NODE) {
    if (reader->curnode == (xmlNodePtr)0x0) {
      reader_local._4_4_ = xmlTextReaderMoveToFirstAttribute(reader);
    }
    else if (reader->curnode->type == XML_NAMESPACE_DECL) {
      if (reader->curnode->_private == (void *)0x0) {
        if (reader->node->properties == (_xmlAttr *)0x0) {
          reader_local._4_4_ = 0;
        }
        else {
          reader->curnode = (xmlNodePtr)reader->node->properties;
          reader_local._4_4_ = 1;
        }
      }
      else {
        reader->curnode = (xmlNodePtr)reader->curnode->_private;
        reader_local._4_4_ = 1;
      }
    }
    else if ((reader->curnode->type == XML_ATTRIBUTE_NODE) &&
            (reader->curnode->next != (_xmlNode *)0x0)) {
      reader->curnode = reader->curnode->next;
      reader_local._4_4_ = 1;
    }
    else {
      reader_local._4_4_ = 0;
    }
  }
  else {
    reader_local._4_4_ = 0;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderMoveToNextAttribute(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);
    if (reader->curnode == NULL)
	return(xmlTextReaderMoveToFirstAttribute(reader));

    if (reader->curnode->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) reader->curnode;
	if (ns->next != NULL) {
	    reader->curnode = (xmlNodePtr) ns->next;
	    return(1);
	}
	if (reader->node->properties != NULL) {
	    reader->curnode = (xmlNodePtr) reader->node->properties;
	    return(1);
	}
	return(0);
    } else if ((reader->curnode->type == XML_ATTRIBUTE_NODE) &&
	       (reader->curnode->next != NULL)) {
	reader->curnode = reader->curnode->next;
	return(1);
    }
    return(0);
}